

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::Storage::Storage(Storage *this,LogBuilderPtr *defaultLogBuilder)

{
  EnumType *pEVar1;
  _Rb_tree_header *p_Var2;
  RegisteredHitCounters *pRVar3;
  RegisteredLoggers *pRVar4;
  VRegistry *pVVar5;
  Logger *this_00;
  allocator local_51;
  string local_50;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00131cc8;
  pRVar3 = (RegisteredHitCounters *)operator_new(0x28);
  (pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)0x0;
  *(undefined8 *)
   &(pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe.field_0x8 = 0;
  (pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar3->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00131d48;
  this->m_registeredHitCounters = pRVar3;
  pRVar4 = (RegisteredLoggers *)operator_new(0xd0);
  RegisteredLoggers::RegisteredLoggers(pRVar4,defaultLogBuilder);
  this->m_registeredLoggers = pRVar4;
  pEVar1 = &this->m_flags;
  this->m_flags = 0;
  pVVar5 = (VRegistry *)operator_new(0x48);
  (pVVar5->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00132478;
  *(undefined4 *)&(pVVar5->super_ThreadSafe).field_0xc = 0;
  pVVar5->m_pFlags = pEVar1;
  p_Var2 = &(pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header;
  (pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pVVar5->m_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_vRegistry = pVVar5;
  utils::CommandLineArgs::CommandLineArgs(&this->m_commandLineArgs);
  *(undefined8 *)((long)&(this->m_preRollOutCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_preRollOutCallback).super__Function_base._M_functor =
       defaultPreRollOutCallback;
  (this->m_preRollOutCallback)._M_invoker =
       std::
       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
       ::_M_invoke;
  (this->m_preRollOutCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
       ::_M_manager;
  p_Var2 = &(this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar4 = this->m_registeredLoggers;
  std::__cxx11::string::string((string *)&local_50,"default",&local_51);
  RegisteredLoggers::get(pRVar4,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  pRVar4 = this->m_registeredLoggers;
  std::__cxx11::string::string((string *)&local_50,"performance",&local_51);
  this_00 = RegisteredLoggers::get(pRVar4,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"%datetime %level %msg",&local_51);
  Configurations::setGlobally(&this_00->m_configurations,Format,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::reconfigure(this_00);
  *(byte *)pEVar1 = (byte)*pEVar1 | 2;
  std::__cxx11::string::string((string *)&local_50,"DefaultLogDispatchCallback",&local_51);
  installLogDispatchCallback<el::base::DefaultLogDispatchCallback>(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"DefaultPerformanceTrackingCallback",&local_51);
  installPerformanceTrackingCallback<el::base::DefaultPerformanceTrackingCallback>(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

explicit Storage(const LogBuilderPtr& defaultLogBuilder) :
#endif  // ELPP_ASYNC_LOGGING
        m_registeredHitCounters(new base::RegisteredHitCounters()),
        m_registeredLoggers(new base::RegisteredLoggers(defaultLogBuilder)),
        m_flags(0x0),
        m_vRegistry(new base::VRegistry(0, &m_flags)),
#if ELPP_ASYNC_LOGGING
        m_asyncLogQueue(new base::AsyncLogQueue()),
        m_asyncDispatchWorker(asyncDispatchWorker),
#endif  // ELPP_ASYNC_LOGGING
        m_preRollOutCallback(base::defaultPreRollOutCallback) {
        // Register default logger
        m_registeredLoggers->get(std::string(base::consts::kDefaultLoggerId));
        // Register performance logger and reconfigure format
        Logger* performanceLogger = m_registeredLoggers->get(std::string(base::consts::kPerformanceLoggerId));
        performanceLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%datetime %level %msg"));
        performanceLogger->reconfigure();
#if defined(ELPP_SYSLOG)
        // Register syslog logger and reconfigure format
        Logger* sysLogLogger = m_registeredLoggers->get(std::string(base::consts::kSysLogLoggerId));
        sysLogLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%level: %msg"));
        sysLogLogger->reconfigure();
#else
        ELPP_UNUSED(base::consts::kSysLogLoggerId);
#endif //  defined(ELPP_SYSLOG)
        addFlag(LoggingFlag::AllowVerboseIfModuleNotSpecified);
#if ELPP_ASYNC_LOGGING
        installLogDispatchCallback<base::AsyncLogDispatchCallback>(std::string("AsyncLogDispatchCallback"));
#else
        installLogDispatchCallback<base::DefaultLogDispatchCallback>(std::string("DefaultLogDispatchCallback"));
#endif  // ELPP_ASYNC_LOGGING
            installPerformanceTrackingCallback<base::DefaultPerformanceTrackingCallback>(std::string("DefaultPerformanceTrackingCallback"));
            ELPP_INTERNAL_INFO(1, "Easylogging++ has been initialized");
#if ELPP_ASYNC_LOGGING
        m_asyncDispatchWorker->start();
#endif  // ELPP_ASYNC_LOGGING
    }